

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O3

int RGBE_to_RGBdivA2(uchar *image,int width,int height,int rescale_to_max)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  float fVar10;
  float fVar11;
  
  iVar4 = 0;
  if ((0 < height && 0 < width) && image != (uchar *)0x0) {
    if (rescale_to_max == 0) {
      dVar8 = 1.0;
    }
    else {
      fVar5 = find_max_RGBE(image,width,height);
      dVar8 = (double)(65025.0 / fVar5);
    }
    iVar2 = height * width + 1;
    pbVar3 = image + 3;
    iVar4 = 1;
    do {
      dVar9 = ldexp(0.003921568859368563,*pbVar3 - 0x80);
      fVar6 = (float)(dVar9 * dVar8);
      fVar11 = (float)pbVar3[-3] * fVar6;
      fVar10 = (float)pbVar3[-2] * fVar6;
      fVar6 = (float)pbVar3[-1] * fVar6;
      fVar5 = fVar11;
      if (fVar11 <= fVar10) {
        fVar5 = fVar10;
      }
      fVar7 = fVar6;
      if (fVar6 <= fVar5) {
        fVar7 = fVar5;
      }
      iVar1 = 1;
      if ((fVar7 != 0.0) || (NAN(fVar7))) {
        fVar7 = 65025.0 / fVar7;
        if (fVar7 < 0.0) {
          fVar7 = sqrtf(fVar7);
        }
        else {
          fVar7 = SQRT(fVar7);
        }
        iVar1 = (int)fVar7;
      }
      if (iVar1 < 2) {
        iVar1 = 1;
      }
      if (0xfe < iVar1) {
        iVar1 = 0xff;
      }
      *pbVar3 = (byte)iVar1;
      fVar5 = (float)(iVar1 * iVar1);
      iVar1 = (int)((fVar11 * fVar5) / 255.0 + 0.5);
      if (0xfe < iVar1) {
        iVar1 = 0xff;
      }
      pbVar3[-3] = (byte)iVar1;
      iVar1 = (int)((fVar10 * fVar5) / 255.0 + 0.5);
      if (0xfe < iVar1) {
        iVar1 = 0xff;
      }
      pbVar3[-2] = (byte)iVar1;
      iVar1 = (int)((fVar6 * fVar5) / 255.0 + 0.5);
      if (0xfe < iVar1) {
        iVar1 = 0xff;
      }
      pbVar3[-1] = (byte)iVar1;
      iVar2 = iVar2 + -1;
      pbVar3 = pbVar3 + 4;
    } while (1 < iVar2);
  }
  return iVar4;
}

Assistant:

int
RGBE_to_RGBdivA2
(
    unsigned char *image,
    int width, int height,
    int rescale_to_max
)
{
	/* local variables */
	int i, iv;
	unsigned char *img = image;
	float scale = 1.0f;
	/* error check */
	if( (!image) || (width < 1) || (height < 1) )
	{
		return 0;
	}
	/* convert (note: no negative numbers, but 0.0 is possible) */
	if( rescale_to_max )
	{
		scale = 255.0f * 255.0f / find_max_RGBE( image, width, height );
	}
	for( i = width * height; i > 0; --i )
	{
		/* decode this pixel, and find the max */
		float r,g,b,e, m;
		/* e = scale * powf( 2.0f, img[3] - 128.0f ) / 255.0f; */
		e = scale * ldexp( 1.0f / 255.0f, (int)(img[3]) - 128 );
		r = e * img[0];
		g = e * img[1];
		b = e * img[2];
		m = (r > g) ? r : g;
		m = (b > m) ? b : m;
		/* and encode it into RGBdivA */
		iv = (m != 0.0f) ? (int)sqrtf( 255.0f * 255.0f / m ) : 1.0f;
		iv = (iv < 1) ? 1 : iv;
		img[3] = (iv > 255) ? 255 : iv;
		iv = (int)(img[3] * img[3] * r / 255.0f + 0.5f);
		img[0] = (iv > 255) ? 255 : iv;
		iv = (int)(img[3] * img[3] * g / 255.0f + 0.5f);
		img[1] = (iv > 255) ? 255 : iv;
		iv = (int)(img[3] * img[3] * b / 255.0f + 0.5f);
		img[2] = (iv > 255) ? 255 : iv;
		/* and on to the next pixel */
		img += 4;
	}
	return 1;
}